

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_read(uv_fs_t *req)

{
  uint uVar1;
  int *piVar2;
  ssize_t local_20;
  ssize_t result;
  uint iovmax;
  uv_fs_t *req_local;
  
  uVar1 = uv__getiovmax();
  if (uVar1 < req->nbufs) {
    req->nbufs = uVar1;
  }
  if (req->off < 0) {
    if (req->nbufs == 1) {
      local_20 = read(req->file,req->bufs->base,req->bufs->len);
    }
    else {
      local_20 = readv(req->file,(iovec *)req->bufs,req->nbufs);
    }
  }
  else if (req->nbufs == 1) {
    local_20 = pread(req->file,req->bufs->base,req->bufs->len,req->off);
  }
  else {
    if (uv__fs_read::no_preadv == 0) {
      local_20 = uv__preadv(req->file,(iovec *)req->bufs,req->nbufs,req->off);
      if ((local_20 != -1) || (piVar2 = __errno_location(), *piVar2 != 0x26)) goto LAB_00bdb2c2;
      uv__fs_read::no_preadv = 1;
    }
    local_20 = uv__fs_preadv(req->file,req->bufs,req->nbufs,req->off);
  }
LAB_00bdb2c2:
  if (req->bufs != req->bufsml) {
    uv__free(req->bufs);
  }
  req->bufs = (uv_buf_t *)0x0;
  req->nbufs = 0;
  return local_20;
}

Assistant:

static ssize_t uv__fs_read(uv_fs_t* req) {
#if defined(__linux__)
  static int no_preadv;
#endif
  unsigned int iovmax;
  ssize_t result;

  iovmax = uv__getiovmax();
  if (req->nbufs > iovmax)
    req->nbufs = iovmax;

  if (req->off < 0) {
    if (req->nbufs == 1)
      result = read(req->file, req->bufs[0].base, req->bufs[0].len);
    else
      result = readv(req->file, (struct iovec*) req->bufs, req->nbufs);
  } else {
    if (req->nbufs == 1) {
      result = pread(req->file, req->bufs[0].base, req->bufs[0].len, req->off);
      goto done;
    }

#if HAVE_PREADV
    result = preadv(req->file, (struct iovec*) req->bufs, req->nbufs, req->off);
#else
# if defined(__linux__)
    if (uv__load_relaxed(&no_preadv)) retry:
# endif
    {
      result = uv__fs_preadv(req->file, req->bufs, req->nbufs, req->off);
    }
# if defined(__linux__)
    else {
      result = uv__preadv(req->file,
                          (struct iovec*)req->bufs,
                          req->nbufs,
                          req->off);
      if (result == -1 && errno == ENOSYS) {
        uv__store_relaxed(&no_preadv, 1);
        goto retry;
      }
    }
# endif
#endif
  }

done:
  /* Early cleanup of bufs allocation, since we're done with it. */
  if (req->bufs != req->bufsml)
    uv__free(req->bufs);

  req->bufs = NULL;
  req->nbufs = 0;

#ifdef __PASE__
  /* PASE returns EOPNOTSUPP when reading a directory, convert to EISDIR */
  if (result == -1 && errno == EOPNOTSUPP) {
    struct stat buf;
    ssize_t rc;
    rc = fstat(req->file, &buf);
    if (rc == 0 && S_ISDIR(buf.st_mode)) {
      errno = EISDIR;
    }
  }
#endif

  return result;
}